

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool sx_ishex(char *str)

{
  char cVar1;
  char *pcVar2;
  _Bool _Var3;
  
  cVar1 = *str;
  _Var3 = cVar1 == '\0';
  if ((!_Var3) &&
     (((byte)(cVar1 - 0x30U) < 10 ||
      ((byte)(cVar1 + ((byte)(cVar1 + 0xbfU) < 0x1a) * ' ' + 0x9fU) < 6)))) {
    pcVar2 = str + 1;
    do {
      cVar1 = *pcVar2;
      _Var3 = cVar1 == '\0';
      if (_Var3) {
        return _Var3;
      }
      pcVar2 = pcVar2 + 1;
    } while (((byte)(cVar1 - 0x30U) < 10) ||
            ((byte)(cVar1 + ((byte)(cVar1 + 0xbfU) < 0x1a) * ' ' + 0x9fU) < 6));
  }
  return _Var3;
}

Assistant:

bool sx_ishex(const char* str)
{
    while (*str) {
        if (!sx_ishexchar(*str))
            return false;
        ++str;
    }
    return true;
}